

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch_amalgamated.cpp
# Opt level: O3

bool __thiscall Catch::Generators::GeneratorUntypedBase::countedNext(GeneratorUntypedBase *this)

{
  int iVar1;
  
  iVar1 = (**this->_vptr_GeneratorUntypedBase)();
  if (SUB41(iVar1,0) != false) {
    (this->m_stringReprCache)._M_string_length = 0;
    *(this->m_stringReprCache)._M_dataplus._M_p = '\0';
    this->m_currentElementIndex = this->m_currentElementIndex + 1;
  }
  return SUB41(iVar1,0);
}

Assistant:

bool GeneratorUntypedBase::countedNext() {
            auto ret = next();
            if ( ret ) {
                m_stringReprCache.clear();
                ++m_currentElementIndex;
            }
            return ret;
        }